

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

int __thiscall QTreeView::sizeHintForColumn(QTreeView *this,int column)

{
  byte bVar1;
  QTreeViewPrivate *this_00;
  QArrayData *pQVar2;
  QTreeViewItem *pQVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint firstVisual;
  uint uVar7;
  int iVar8;
  QWidget *pQVar9;
  long lVar10;
  byte *pbVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  QTreeViewItem *pQVar16;
  long in_FS_OFFSET;
  int offset;
  QStyleOptionViewItem option;
  QModelIndex local_148;
  QModelIndex local_128;
  int local_10c;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  if ((this_00->viewItems).d.size == 0) {
    iVar8 = -1;
  }
  else {
    QWidget::ensurePolished((QWidget *)this);
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(this,&local_108);
    pQVar2 = &((this_00->viewItems).d.d)->super_QArrayData;
    pQVar3 = (this_00->viewItems).d.ptr;
    lVar10 = (this_00->viewItems).d.size;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    iVar6 = QHeaderView::resizeContentsPrecision(this_00->header);
    local_10c = 0;
    firstVisual = QTreeViewPrivate::firstVisibleItem(this_00,&local_10c);
    uVar7 = QTreeViewPrivate::lastVisibleItem(this_00,firstVisual,local_10c);
    iVar4 = (int)lVar10;
    if (((int)(uVar7 | firstVisual) < 0) || (lVar10 - 1U == (ulong)uVar7)) {
      uVar7 = iVar4 - 1;
      if (iVar6 < 0) {
        firstVisual = 0;
      }
      else if (iVar6 == 0) {
        pQVar9 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
        firstVisual = 0;
        if (0 < (int)(iVar4 - 2U)) {
          uVar13 = iVar4 - 2U;
          for (iVar8 = ((pQVar9->data->crect).y2.m_i - (pQVar9->data->crect).y1.m_i) + 1;
              firstVisual = uVar13, 0 < iVar8; iVar8 = iVar8 - iVar14) {
            iVar14 = QTreeViewPrivate::itemHeight(this_00,uVar13);
            firstVisual = uVar13 - 1;
            if (uVar13 == 1) break;
            uVar13 = uVar13 - 1;
          }
        }
      }
      else {
        firstVisual = 0;
        if (0 < (int)(uVar7 - iVar6)) {
          firstVisual = uVar7 - iVar6;
        }
      }
    }
    iVar8 = 0;
    iVar14 = 0;
    if ((int)firstVisual <= (int)uVar7) {
      pQVar16 = pQVar3 + (int)firstVisual;
      iVar14 = 0;
      iVar8 = 0;
      uVar13 = firstVisual;
      do {
        if ((pQVar16->field_0x1c & 2) == 0) {
          local_128.m.ptr = (pQVar16->index).m.ptr;
          local_128.r = (pQVar16->index).r;
          local_128.c = (pQVar16->index).c;
          local_128.i = (pQVar16->index).i;
          if (local_128.m.ptr == (QAbstractItemModel *)0x0) {
            local_148.r = -1;
            local_148.c = -1;
            local_148.i = 0;
            local_148.m.ptr = (QAbstractItemModel *)0x0;
            local_128._0_8_ = local_148._0_8_;
            local_128.i = local_148.i;
            local_128.m.ptr = local_148.m.ptr;
          }
          else if ((pQVar16->index).c != column) {
            (**(code **)(*(long *)local_128.m.ptr + 0x70))
                      (&local_148,local_128.m.ptr,(pQVar16->index).r,column,&local_128);
            local_128._0_8_ = local_148._0_8_;
            local_128.i = local_148.i;
            local_128.m.ptr = local_148.m.ptr;
          }
          local_148.m.ptr = local_128.m.ptr;
          local_148.i = local_128.i;
          local_148._0_8_ = local_128._0_8_;
          local_128.m.ptr = local_148.m.ptr;
          local_128.r = local_148.r;
          local_128.c = local_148.c;
          local_128.i = local_148.i;
          iVar8 = QTreeViewPrivate::widthHintForIndex(this_00,&local_128,iVar8,&local_108,uVar13);
          iVar14 = iVar14 + 1;
          if (iVar14 == iVar6) goto LAB_005a7afa;
        }
        uVar13 = uVar13 + 1;
        pQVar16 = pQVar16 + 1;
      } while (uVar7 + 1 != uVar13);
    }
    if (iVar14 != iVar6 && iVar6 != 0) {
      uVar13 = iVar4 - 1;
      uVar15 = (ulong)(uVar7 - 1);
      do {
        uVar7 = (uint)uVar15;
        if (((int)firstVisual < 1) && ((int)uVar13 <= (int)uVar7)) break;
        if (((0 < (int)firstVisual & (byte)iVar14) == 0) && (uVar7 != uVar13)) {
          lVar10 = (long)(int)uVar7;
          uVar5 = uVar13;
          if ((int)uVar13 < (int)uVar7) {
            uVar5 = uVar7;
          }
          pbVar11 = &pQVar3[lVar10 + 1].field_0x1c;
          uVar12 = 0;
          do {
            if (lVar10 - (int)uVar5 == uVar12) {
              uVar15 = (ulong)uVar5;
              goto LAB_005a7af0;
            }
            uVar12 = uVar12 - 1;
            bVar1 = *pbVar11;
            pbVar11 = pbVar11 + 0x28;
          } while ((bVar1 & 2) != 0);
          uVar15 = (uVar15 & 0xffffffff) - uVar12;
          if (-2 < (long)(~uVar12 + lVar10)) {
            uVar12 = uVar15 & 0xffffffff;
            goto LAB_005a7a3b;
          }
        }
        else {
          pbVar11 = &pQVar3[(ulong)firstVisual - 1].field_0x1c;
          do {
            if ((int)firstVisual < 1) goto LAB_005a7af0;
            firstVisual = firstVisual - 1;
            bVar1 = *pbVar11;
            pbVar11 = pbVar11 + -0x28;
          } while ((bVar1 & 2) != 0);
          uVar12 = (ulong)firstVisual;
LAB_005a7a3b:
          local_128.m.ptr = pQVar3[uVar12].index.m.ptr;
          pQVar16 = pQVar3 + uVar12;
          local_128.r = (pQVar16->index).r;
          local_128.c = (pQVar16->index).c;
          local_128.i = (pQVar16->index).i;
          if (local_128.m.ptr == (QAbstractItemModel *)0x0) {
            local_148.r = -1;
            local_148.c = -1;
            local_148.i = 0;
            local_148.m.ptr = (QAbstractItemModel *)0x0;
            local_128._0_8_ = local_148._0_8_;
            local_128.i = local_148.i;
            local_128.m.ptr = local_148.m.ptr;
          }
          else if ((pQVar16->index).c != column) {
            (**(code **)(*(long *)local_128.m.ptr + 0x70))
                      (&local_148,local_128.m.ptr,(pQVar16->index).r,column,&local_128);
            local_128._0_8_ = local_148._0_8_;
            local_128.i = local_148.i;
            local_128.m.ptr = local_148.m.ptr;
          }
          local_148.m.ptr = local_128.m.ptr;
          local_148.i = local_128.i;
          local_148._0_8_ = local_128._0_8_;
          local_128.m.ptr = local_148.m.ptr;
          local_128.r = local_148.r;
          local_128.c = local_148.c;
          local_128.i = local_148.i;
          iVar8 = QTreeViewPrivate::widthHintForIndex
                            (this_00,&local_128,iVar8,&local_108,(int)uVar12);
          iVar14 = iVar14 + 1;
        }
LAB_005a7af0:
      } while (iVar14 != iVar6);
    }
LAB_005a7afa:
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,0x28,0x10);
      }
    }
    QBrush::~QBrush(&local_108.backgroundBrush);
    if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_108.icon);
    QLocale::~QLocale(&local_108.locale);
    QFont::~QFont(&local_108.font);
    QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

int QTreeView::sizeHintForColumn(int column) const
{
    Q_D(const QTreeView);
    d->executePostedLayout();
    if (d->viewItems.isEmpty())
        return -1;
    ensurePolished();
    int w = 0;
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    const QList<QTreeViewItem> viewItems = d->viewItems;

    const int maximumProcessRows = d->header->resizeContentsPrecision(); // To avoid this to take forever.

    int offset = 0;
    int start = d->firstVisibleItem(&offset);
    int end = d->lastVisibleItem(start, offset);
    if (start < 0 || end < 0 || end == viewItems.size() - 1) {
        end = viewItems.size() - 1;
        if (maximumProcessRows < 0) {
            start = 0;
        } else if (maximumProcessRows == 0) {
            start = qMax(0, end - 1);
            int remainingHeight = viewport()->height();
            while (start > 0 && remainingHeight > 0) {
                remainingHeight -= d->itemHeight(start);
                --start;
            }
        } else {
            start = qMax(0, end - maximumProcessRows);
        }
    }

    int rowsProcessed = 0;

    for (int i = start; i <= end; ++i) {
        if (viewItems.at(i).spanning)
            continue; // we have no good size hint
        QModelIndex index = viewItems.at(i).index;
        index = index.sibling(index.row(), column);
        w = d->widthHintForIndex(index, w, option, i);
        ++rowsProcessed;
        if (rowsProcessed == maximumProcessRows)
            break;
    }

    --end;
    int actualBottom = viewItems.size() - 1;

    if (maximumProcessRows == 0)
        rowsProcessed = 0; // skip the while loop

    while (rowsProcessed != maximumProcessRows && (start > 0 || end < actualBottom)) {
        int idx  = -1;

        if ((rowsProcessed % 2 && start > 0) || end == actualBottom) {
            while (start > 0) {
                --start;
                if (viewItems.at(start).spanning)
                    continue;
                idx = start;
                break;
            }
        } else {
            while (end < actualBottom) {
                ++end;
                if (viewItems.at(end).spanning)
                    continue;
                idx = end;
                break;
            }
        }
        if (idx < 0)
            continue;

        QModelIndex index = viewItems.at(idx).index;
        index = index.sibling(index.row(), column);
        w = d->widthHintForIndex(index, w, option, idx);
        ++rowsProcessed;
    }
    return w;
}